

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void ArgmaxTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  float *location;
  typed_option<float> *ptVar1;
  option_group_definition *poVar2;
  uint uVar3;
  allocator local_326;
  allocator local_325;
  allocator local_324;
  allocator local_323;
  allocator local_322;
  allocator local_321;
  string local_320 [32];
  string local_300;
  string local_2e0 [32];
  string local_2c0;
  string local_2a0 [32];
  string local_280;
  string local_260;
  option_group_definition new_options;
  undefined1 local_208 [160];
  typed_option<float> local_168;
  typed_option<float> local_c8;
  
  location = (float *)operator_new(0xc);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  std::__cxx11::string::string((string *)&local_260,"argmax options",(allocator *)&local_168);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string((string *)&local_280,"cost",&local_321);
  VW::config::typed_option<float>::typed_option(&local_168,&local_280,location);
  ptVar1 = VW::config::typed_option<float>::default_value(&local_168,10.0);
  std::__cxx11::string::string(local_2a0,"False Negative Cost",&local_322);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (&new_options,ptVar1);
  std::__cxx11::string::string((string *)&local_2c0,"negative_weight",&local_323);
  VW::config::typed_option<float>::typed_option(&local_c8,&local_2c0,location + 1);
  ptVar1 = VW::config::typed_option<float>::default_value(&local_c8,1.0);
  std::__cxx11::string::string(local_2e0,"Relative weight of negative examples",&local_324);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar1)
  ;
  std::__cxx11::string::string((string *)&local_300,"max",&local_325);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_208,&local_300,(bool *)(location + 2));
  std::__cxx11::string::string(local_320,"Disable structure: just predict the max",&local_326);
  std::__cxx11::string::_M_assign((string *)(local_208 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar2,(typed_option<bool> *)local_208);
  std::__cxx11::string::~string(local_320);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_208);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string(local_2e0);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string(local_2a0);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_280);
  (**options->_vptr_options_i)(options);
  sch->task_data = location;
  uVar3 = 0;
  if (*(char *)(location + 2) == '\0') {
    uVar3 = Search::AUTO_CONDITION_FEATURES;
  }
  Search::search::set_options(sch,uVar3 | Search::EXAMPLES_DONT_CHANGE);
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("argmax options");
  new_options.add(make_option("cost", D->false_negative_cost).default_value(10.0f).help("False Negative Cost"))
      .add(make_option("negative_weight", D->negative_weight)
               .default_value(1.f)
               .help("Relative weight of negative examples"))
      .add(make_option("max", D->predict_max).help("Disable structure: just predict the max"));
  options.add_and_parse(new_options);

  sch.set_task_data(D);

  if (D->predict_max)
    sch.set_options(Search::EXAMPLES_DONT_CHANGE);  // we don't do any internal example munging
  else
    sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
        Search::EXAMPLES_DONT_CHANGE);                 // we don't do any internal example munging
}